

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void UnpackAccumulativeOffsetsIntoRanges
               (int base_codepoint,short *accumulative_offsets,int accumulative_offsets_count,
               ImWchar *out_ranges)

{
  ImWchar IVar1;
  int n;
  ImWchar *out_ranges_local;
  int accumulative_offsets_count_local;
  short *accumulative_offsets_local;
  int base_codepoint_local;
  
  out_ranges_local = out_ranges;
  base_codepoint_local = base_codepoint;
  for (n = 0; n < accumulative_offsets_count; n = n + 1) {
    IVar1 = (short)base_codepoint_local + accumulative_offsets[n];
    out_ranges_local[1] = IVar1;
    *out_ranges_local = IVar1;
    base_codepoint_local = accumulative_offsets[n] + base_codepoint_local;
    out_ranges_local = out_ranges_local + 2;
  }
  *out_ranges_local = 0;
  return;
}

Assistant:

static void UnpackAccumulativeOffsetsIntoRanges(int base_codepoint, const short* accumulative_offsets, int accumulative_offsets_count, ImWchar* out_ranges)
{
    for (int n = 0; n < accumulative_offsets_count; n++, out_ranges += 2)
    {
        out_ranges[0] = out_ranges[1] = (ImWchar)(base_codepoint + accumulative_offsets[n]);
        base_codepoint += accumulative_offsets[n];
    }
    out_ranges[0] = 0;
}